

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O1

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::TableFunction
          (Relation *this,string *fname,vector<duckdb::Value,_true> *values,
          named_parameter_map_t *named_parameters)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  *in_R8;
  shared_ptr<duckdb::Relation,_true> sVar3;
  undefined1 local_79;
  shared_ptr<duckdb::TableFunctionRelation,_true> local_78;
  undefined1 local_60 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  shared_ptr<duckdb::TableFunctionRelation> local_40;
  
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->
            ((shared_ptr<duckdb::ClientContextWrapper,_true> *)((long)&fname->field_2 + 8));
  ClientContextWrapper::GetContext((ClientContextWrapper *)local_60);
  enable_shared_from_this<duckdb::Relation>::shared_from_this
            ((enable_shared_from_this<duckdb::Relation> *)(local_60 + 0x10));
  local_40.super___shared_ptr<duckdb::TableFunctionRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::TableFunctionRelation,std::allocator<duckdb::TableFunctionRelation>,duckdb::shared_ptr<duckdb::ClientContext,true>,std::__cxx11::string_const&,duckdb::vector<duckdb::Value,true>const&,std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>const&,duckdb::shared_ptr<duckdb::Relation,true>>
            (&local_40.super___shared_ptr<duckdb::TableFunctionRelation,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(TableFunctionRelation **)&local_40,
             (allocator<duckdb::TableFunctionRelation> *)&local_79,
             (shared_ptr<duckdb::ClientContext,_true> *)local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)values,
             (vector<duckdb::Value,_true> *)named_parameters,in_R8,
             (shared_ptr<duckdb::Relation,_true> *)(local_60 + 0x10));
  shared_ptr<duckdb::TableFunctionRelation,_true>::shared_ptr(&local_78,&local_40);
  _Var2._M_pi = extraout_RDX;
  if (local_40.super___shared_ptr<duckdb::TableFunctionRelation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super___shared_ptr<duckdb::TableFunctionRelation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  _Var1._M_pi = local_78.internal.
                super___shared_ptr<duckdb::TableFunctionRelation,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_78.internal.super___shared_ptr<duckdb::TableFunctionRelation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Relation =
       (_func_int **)
       local_78.internal.
       super___shared_ptr<duckdb::TableFunctionRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_78.internal.super___shared_ptr<duckdb::TableFunctionRelation,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    _Var2._M_pi = extraout_RDX_01;
  }
  if ((element_type *)local_60._8_8_ != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
    _Var2._M_pi = extraout_RDX_02;
  }
  sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Relation::TableFunction(const std::string &fname, const vector<Value> &values,
                                             const named_parameter_map_t &named_parameters) {
	return make_shared_ptr<TableFunctionRelation>(context->GetContext(), fname, values, named_parameters,
	                                              shared_from_this());
}